

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool __thiscall cmSetPropertyCommand::HandleTest(cmSetPropertyCommand *this,cmTest *test)

{
  char *pcVar1;
  pointer value;
  allocator local_39;
  string local_38;
  
  if (this->Remove == false) {
    value = (this->PropertyValue)._M_dataplus._M_p;
  }
  else {
    value = (char *)0x0;
  }
  pcVar1 = (this->PropertyName)._M_dataplus._M_p;
  if (this->AppendMode == true) {
    std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
    cmTest::AppendProperty(test,&local_38,value,this->AppendAsString);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
    cmTest::SetProperty(test,&local_38,value);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmSetPropertyCommand::HandleTest(cmTest* test)
{
  // Set or append the property.
  const char* name = this->PropertyName.c_str();
  const char *value = this->PropertyValue.c_str();
  if (this->Remove)
    {
    value = 0;
    }
  if(this->AppendMode)
    {
    test->AppendProperty(name, value, this->AppendAsString);
    }
  else
    {
    test->SetProperty(name, value);
    }

  return true;
}